

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Geometry2D.cpp
# Opt level: O1

void __thiscall Assimp::X3DImporter::ParseNode_Geometry2D_TriangleSet2D(X3DImporter *this)

{
  size_t *psVar1;
  FIReader *pFVar2;
  char *pcVar3;
  CX3DImporter_NodeElement *pCVar4;
  list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_> *plVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  undefined4 extraout_var_00;
  char *__s;
  undefined4 extraout_var_02;
  undefined7 extraout_var;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  runtime_error *this_00;
  string *psVar11;
  int pAttrIdx;
  ulong uVar12;
  CX3DImporter_NodeElement *ne;
  string an;
  string use;
  string def;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> vertices;
  CX3DImporter_NodeElement *local_c8;
  allocator<char> local_b9;
  undefined8 local_b8;
  string local_b0;
  X3DImporter *local_90;
  string local_88;
  string local_68;
  list<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> local_48;
  undefined4 extraout_var_01;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_88._M_string_length = 0;
  local_88.field_2._M_local_buf[0] = '\0';
  local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_48;
  local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  _M_size = 0;
  local_c8 = (CX3DImporter_NodeElement *)0x0;
  local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  uVar7 = (*(((this->mReader)._M_t.
              super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
              super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
              super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
            super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[4])();
  uVar12 = 0;
  if (0 < (int)uVar7) {
    local_b8 = 0;
    local_90 = this;
    do {
      pFVar2 = (this->mReader)._M_t.
               super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
               super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
               super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
      pAttrIdx = (int)uVar12;
      iVar8 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[5])
                        (pFVar2,uVar12);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,(char *)CONCAT44(extraout_var_00,iVar8),&local_b9);
      iVar8 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar8 == 0) {
        iVar8 = (*(((this->mReader)._M_t.
                    super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                    .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                  super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
        __s = (char *)CONCAT44(extraout_var_01,iVar8);
        psVar11 = &local_68;
LAB_006acb6a:
        pcVar3 = (char *)psVar11->_M_string_length;
        strlen(__s);
        std::__cxx11::string::_M_replace((ulong)psVar11,0,pcVar3,(ulong)__s);
        this = local_90;
      }
      else {
        iVar8 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar8 == 0) {
          iVar8 = (*(((this->mReader)._M_t.
                      super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>
                      .super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
                    super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])();
          __s = (char *)CONCAT44(extraout_var_02,iVar8);
          psVar11 = &local_88;
          goto LAB_006acb6a;
        }
        iVar8 = std::__cxx11::string::compare((char *)&local_b0);
        if (((iVar8 != 0) && (iVar8 = std::__cxx11::string::compare((char *)&local_b0), iVar8 != 0))
           && (iVar8 = std::__cxx11::string::compare((char *)&local_b0), iVar8 != 0)) {
          iVar8 = std::__cxx11::string::compare((char *)&local_b0);
          if (iVar8 == 0) {
            XML_ReadNode_GetAttrVal_AsListVec2f(this,pAttrIdx,&local_48);
          }
          else {
            iVar8 = std::__cxx11::string::compare((char *)&local_b0);
            if (iVar8 == 0) {
              bVar6 = XML_ReadNode_GetAttrVal_AsBool(this,pAttrIdx);
              local_b8 = CONCAT71(extraout_var,bVar6);
            }
            else {
              Throw_IncorrectAttr(this,&local_b0);
            }
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      uVar12 = (ulong)(pAttrIdx + 1U);
    } while (uVar7 != pAttrIdx + 1U);
    uVar12 = (ulong)((byte)local_b8 & 1);
  }
  if (local_88._M_string_length == 0) {
    if (0x5555555555555555 <
        local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl.
        _M_node._M_size * -0x5555555555555555) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b0,"TriangleSet2D. Not enough points for defining triangle.","");
      std::runtime_error::runtime_error(this_00,(string *)&local_b0);
      *(undefined ***)this_00 = &PTR__runtime_error_0082bce0;
      __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_c8 = (CX3DImporter_NodeElement *)operator_new(0x78);
    pCVar4 = this->NodeElement_Cur;
    local_c8->Type = ENET_TriangleSet2D;
    (local_c8->ID)._M_dataplus._M_p = (pointer)&(local_c8->ID).field_2;
    (local_c8->ID)._M_string_length = 0;
    (local_c8->ID).field_2._M_local_buf[0] = '\0';
    local_c8->Parent = pCVar4;
    (local_c8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_c8->Child;
    (local_c8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_c8->Child;
    (local_c8->Child).
    super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>.
    _M_impl._M_node._M_size = 0;
    local_c8->_vptr_CX3DImporter_NodeElement =
         (_func_int **)&PTR__CX3DImporter_NodeElement_Geometry2D_008ff818;
    *(CX3DImporter_NodeElement **)&local_c8[1].Type = local_c8 + 1;
    local_c8[1]._vptr_CX3DImporter_NodeElement = (_func_int **)(local_c8 + 1);
    local_c8[1].ID._M_dataplus._M_p = (pointer)0x0;
    local_c8[1].ID.field_2._M_local_buf[0] = '\x01';
    p_Var9 = local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    if (local_68._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&local_c8->ID);
      p_Var9 = local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>.
               _M_impl._M_node.super__List_node_base._M_next;
    }
    for (; pCVar4 = local_c8, p_Var9 != (_List_node_base *)&local_48;
        p_Var9 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
                  &p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_90 = (X3DImporter *)CONCAT44(local_90._4_4_,(int)*(size_t *)(p_Var9 + 1));
      local_b8 = CONCAT44(local_b8._4_4_,*(undefined4 *)((long)(p_Var9 + 1) + 4));
      p_Var10 = (_List_node_base *)operator_new(0x20);
      *(undefined4 *)&p_Var10[1]._M_next = local_90._0_4_;
      *(undefined4 *)((long)&p_Var10[1]._M_next + 4) = (undefined4)local_b8;
      *(undefined4 *)&p_Var10[1]._M_prev = 0;
      std::__detail::_List_node_base::_M_hook(p_Var10);
      pCVar4[1].ID._M_dataplus._M_p = pCVar4[1].ID._M_dataplus._M_p + 1;
    }
    local_c8[1].ID.field_2._M_local_buf[0] = (char)uVar12;
    local_c8[1].ID._M_string_length = 3;
    iVar8 = (*(((this->mReader)._M_t.
                super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t
                .super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
                super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl)->
              super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0xf])();
    pCVar4 = local_c8;
    if ((char)iVar8 == '\0') {
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"TriangleSet2D","");
      ParseNode_Metadata(this,pCVar4,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      pCVar4 = this->NodeElement_Cur;
      p_Var9 = (_List_node_base *)operator_new(0x18);
      p_Var9[1]._M_next = (_List_node_base *)local_c8;
      std::__detail::_List_node_base::_M_hook(p_Var9);
      psVar1 = &(pCVar4->Child).
                super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                ._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_c8;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &this->NodeElement_List;
  }
  else {
    XML_CheckNode_MustBeEmpty(this);
    if (local_68._M_string_length != 0) {
      Throw_DEF_And_USE(this);
    }
    bVar6 = FindNodeElement(this,&local_88,ENET_TriangleSet2D,&local_c8);
    if (!bVar6) {
      Throw_USE_NotFound(this,&local_88);
    }
    pCVar4 = this->NodeElement_Cur;
    p_Var9 = (_List_node_base *)operator_new(0x18);
    p_Var9[1]._M_next = (_List_node_base *)local_c8;
    std::__detail::_List_node_base::_M_hook(p_Var9);
    plVar5 = &pCVar4->Child;
  }
  psVar1 = &(plVar5->
            super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
            )._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  p_Var9 = local_48.super__List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>._M_impl
           ._M_node.super__List_node_base._M_next;
  while (p_Var9 != (_List_node_base *)&local_48) {
    p_Var10 = (((_List_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *)
               &p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    operator_delete(p_Var9,0x18);
    p_Var9 = p_Var10;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,
                    CONCAT71(local_88.field_2._M_allocated_capacity._1_7_,
                             local_88.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Geometry2D_TriangleSet2D()
{
    std::string def, use;
    bool solid = false;
    std::list<aiVector2D> vertices;
    CX3DImporter_NodeElement* ne( nullptr );

	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECKUSEDEF_RET(def, use);
		MACRO_ATTRREAD_CHECK_REF("vertices", vertices, XML_ReadNode_GetAttrVal_AsListVec2f);
		MACRO_ATTRREAD_CHECK_RET("solid", solid, XML_ReadNode_GetAttrVal_AsBool);
	MACRO_ATTRREAD_LOOPEND;

	// if "USE" defined then find already defined element.
	if(!use.empty())
	{
		MACRO_USE_CHECKANDAPPLY(def, use, ENET_TriangleSet2D, ne);
	}
	else
	{
		if(vertices.size() % 3) throw DeadlyImportError("TriangleSet2D. Not enough points for defining triangle.");

		// create and if needed - define new geometry object.
		ne = new CX3DImporter_NodeElement_Geometry2D(CX3DImporter_NodeElement::ENET_TriangleSet2D, NodeElement_Cur);
		if(!def.empty()) ne->ID = def;

		// convert vec2 to vec3
		for(std::list<aiVector2D>::iterator it2 = vertices.begin(); it2 != vertices.end(); ++it2)
		{
			((CX3DImporter_NodeElement_Geometry2D*)ne)->Vertices.push_back(aiVector3D(it2->x, it2->y, 0));
		}

		((CX3DImporter_NodeElement_Geometry2D*)ne)->Solid = solid;
		((CX3DImporter_NodeElement_Geometry2D*)ne)->NumIndices = 3;
		// check for X3DMetadataObject childs.
		if(!mReader->isEmptyElement())
			ParseNode_Metadata(ne, "TriangleSet2D");
		else
			NodeElement_Cur->Child.push_back(ne);// add made object as child to current element

		NodeElement_List.push_back(ne);// add element to node element list because its a new object in graph
	}// if(!use.empty()) else
}